

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O2

BDD sylvan_sat_one_bdd(BDD bdd)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  BDD high;
  BDD low;
  MTBDD MVar5;
  ulong bdd_00;
  long lVar6;
  
  if ((bdd & 0x7fffffffffffffff) == 0) {
    return bdd;
  }
  puVar1 = nodes->data;
  lVar6 = (bdd & 0xffffffffff) * 0x10;
  uVar2 = *(ulong *)(puVar1 + lVar6);
  uVar4 = bdd & 0x8000000000000000;
  bdd_00 = *(ulong *)(puVar1 + lVar6 + 8) & 0xffffffffff | uVar4;
  if (bdd_00 == 0) {
LAB_00109d6d:
    high = sylvan_sat_one_bdd(uVar2 & 0x800000ffffffffff ^ uVar4);
    uVar3 = (uint)((ulong)*(undefined8 *)(puVar1 + lVar6 + 8) >> 0x20);
    low = 0;
  }
  else {
    if ((uVar2 & 0x800000ffffffffff) != uVar4) {
      uVar3 = rand();
      if ((uVar3 >> 0xd & 1) == 0) goto LAB_00109d6d;
    }
    low = sylvan_sat_one_bdd(bdd_00);
    uVar3 = (uint)((ulong)*(undefined8 *)(puVar1 + lVar6 + 8) >> 0x20);
    high = 0;
  }
  MVar5 = mtbdd_makenode(uVar3 >> 8,low,high);
  return MVar5;
}

Assistant:

BDD
sylvan_sat_one_bdd(BDD bdd)
{
    if (bdd == sylvan_false) return sylvan_false;
    if (bdd == sylvan_true) return sylvan_true;

    bddnode_t node = MTBDD_GETNODE(bdd);
    BDD low = node_low(bdd, node);
    BDD high = node_high(bdd, node);

    BDD m;

    BDD result;
    if (low == sylvan_false) {
        m = sylvan_sat_one_bdd(high);
        result = sylvan_makenode(bddnode_getvariable(node), sylvan_false, m);
    } else if (high == sylvan_false) {
        m = sylvan_sat_one_bdd(low);
        result = sylvan_makenode(bddnode_getvariable(node), m, sylvan_false);
    } else {
        if (rand() & 0x2000) {
            m = sylvan_sat_one_bdd(low);
            result = sylvan_makenode(bddnode_getvariable(node), m, sylvan_false);
        } else {
            m = sylvan_sat_one_bdd(high);
            result = sylvan_makenode(bddnode_getvariable(node), sylvan_false, m);
        }
    }

    return result;
}